

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

QpVector * __thiscall MatrixBase::mat_vec_seq(MatrixBase *this,QpVector *other,QpVector *target)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  QpVector *in_RDX;
  int *in_RSI;
  QpVector *in_RDI;
  HighsInt row;
  HighsInt idx;
  HighsInt col;
  HighsInt i;
  int local_24;
  int local_1c;
  
  QpVector::reset(in_RDI);
  for (local_1c = 0; local_1c < *in_RSI; local_1c = local_1c + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_1c);
    iVar3 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)iVar3);
    local_24 = *pvVar5;
    while( true ) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index,(long)(iVar3 + 1));
      if (*pvVar5 <= local_24) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI->value,(long)local_24);
      iVar4 = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),(long)local_24);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)iVar3);
      dVar2 = *pvVar6;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&in_RDX->value,(long)iVar4);
      *pvVar7 = dVar1 * dVar2 + *pvVar7;
      local_24 = local_24 + 1;
    }
  }
  QpVector::resparsify(in_RDI);
  return in_RDX;
}

Assistant:

QpVector& mat_vec_seq(const QpVector& other, QpVector& target) const {
    target.reset();
    for (HighsInt i = 0; i < other.num_nz; i++) {
      HighsInt col = other.index[i];
      for (HighsInt idx = start[col]; idx < start[col + 1]; idx++) {
        HighsInt row = index[idx];
        target.value[row] += value[idx] * other.value[col];
      }
    }
    target.resparsify();
    return target;
  }